

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcVerify.c
# Opt level: O1

int * Abc_NtkVerifySimulatePattern(Abc_Ntk_t *pNtk,int *pModel)

{
  ulong uVar1;
  Abc_NtkType_t AVar2;
  int iVar3;
  uint uVar4;
  long *plVar5;
  void **ppvVar6;
  int *piVar7;
  Abc_Obj_t *pAVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  long lVar11;
  int iVar12;
  
  AVar2 = pNtk->ntkType;
  if (AVar2 != ABC_NTK_STRASH) {
    pNtk = Abc_NtkStrash(pNtk,0,0,0);
  }
  if ((pNtk->vTravIds).pArray == (int *)0x0) {
    iVar3 = pNtk->vObjs->nSize;
    uVar1 = (long)iVar3 + 500;
    iVar12 = (int)uVar1;
    if ((pNtk->vTravIds).nCap < iVar12) {
      piVar7 = (int *)malloc(uVar1 * 4);
      (pNtk->vTravIds).pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pNtk->vTravIds).nCap = iVar12;
    }
    if (-500 < iVar3) {
      memset((pNtk->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pNtk->vTravIds).nSize = iVar12;
  }
  iVar3 = pNtk->nTravIds;
  pNtk->nTravIds = iVar3 + 1;
  if (iVar3 < 0x3fffffff) {
    pAVar8 = Abc_AigConst1(pNtk);
    pAVar8->field_6 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)0x1;
    pVVar10 = pNtk->vCis;
    if (0 < pVVar10->nSize) {
      lVar9 = 0;
      do {
        *(long *)((long)pVVar10->pArray[lVar9] + 0x40) = (long)pModel[lVar9];
        lVar9 = lVar9 + 1;
        pVVar10 = pNtk->vCis;
      } while (lVar9 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vObjs;
    if (0 < pVVar10->nSize) {
      lVar9 = 0;
      do {
        plVar5 = (long *)pVVar10->pArray[lVar9];
        if ((plVar5 != (long *)0x0) && (uVar4 = *(uint *)((long)plVar5 + 0x14), (uVar4 & 0xf) == 7))
        {
          lVar11 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
          plVar5[8] = (long)(int)((uVar4 >> 0xb & 1 ^
                                  *(uint *)(*(long *)(lVar11 + (long)((int *)plVar5[4])[1] * 8) +
                                           0x40)) &
                                 (uVar4 >> 10 & 1 ^
                                 *(uint *)(*(long *)(lVar11 + (long)*(int *)plVar5[4] * 8) + 0x40)))
          ;
        }
        lVar9 = lVar9 + 1;
        pVVar10 = pNtk->vObjs;
      } while (lVar9 < pVVar10->nSize);
    }
    pVVar10 = pNtk->vCos;
    lVar9 = (long)pVVar10->nSize;
    piVar7 = (int *)malloc(lVar9 * 4);
    if (0 < lVar9) {
      ppvVar6 = pVVar10->pArray;
      lVar11 = 0;
      do {
        plVar5 = (long *)ppvVar6[lVar11];
        piVar7[lVar11] =
             *(uint *)((long)plVar5 + 0x14) >> 10 & 1 ^
             *(uint *)(*(long *)(*(long *)(*(long *)(*plVar5 + 0x20) + 8) +
                                (long)*(int *)plVar5[4] * 8) + 0x40);
        lVar11 = lVar11 + 1;
      } while (lVar9 != lVar11);
    }
    if (AVar2 != ABC_NTK_STRASH) {
      Abc_NtkDelete(pNtk);
    }
    return piVar7;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

int * Abc_NtkVerifySimulatePattern( Abc_Ntk_t * pNtk, int * pModel )
{
    Abc_Obj_t * pNode;
    int * pValues, Value0, Value1, i;
    int fStrashed = 0;
    if ( !Abc_NtkIsStrash(pNtk) )
    {
        pNtk = Abc_NtkStrash(pNtk, 0, 0, 0);
        fStrashed = 1;
    }
/*
    printf( "Counter example: " );
    Abc_NtkForEachCi( pNtk, pNode, i )
        printf( " %d", pModel[i] );
    printf( "\n" );
*/
    // increment the trav ID
    Abc_NtkIncrementTravId( pNtk );
    // set the CI values
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)1;
    Abc_NtkForEachCi( pNtk, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)pModel[i];
    // simulate in the topological order
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Value0 = ((int)(ABC_PTRINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ (int)Abc_ObjFaninC0(pNode);
        Value1 = ((int)(ABC_PTRINT_T)Abc_ObjFanin1(pNode)->pCopy) ^ (int)Abc_ObjFaninC1(pNode);
        pNode->pCopy = (Abc_Obj_t *)(ABC_PTRINT_T)(Value0 & Value1);
    }
    // fill the output values
    pValues = ABC_ALLOC( int, Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachCo( pNtk, pNode, i )
        pValues[i] = ((int)(ABC_PTRINT_T)Abc_ObjFanin0(pNode)->pCopy) ^ (int)Abc_ObjFaninC0(pNode);
    if ( fStrashed )
        Abc_NtkDelete( pNtk );
    return pValues;
}